

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteBuiltin_db_begin(jx9_context *pCtx,int argc,jx9_value **argv)

{
  jx9_value *pObj;
  int iVar1;
  anon_union_8_3_18420de5_for_x aVar2;
  
  iVar1 = unqlitePagerBegin(*(Pager **)(*pCtx->pFunc->pUserData + 0xd8));
  aVar2.iVal._1_7_ = 0;
  aVar2.iVal._0_1_ = iVar1 == 0;
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  pObj->x = aVar2;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_begin(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_vm *pVm;
	unqlite *pDb;
	int rc;
	SXUNUSED(argc); /* cc warning */
	SXUNUSED(argv);
	/* Point to the unqlite Vm */
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Point to the underlying database handle  */
	pDb = pVm->pDb;
	/* Begin the transaction */
	rc = unqlitePagerBegin(pDb->sDB.pPager);
	/* result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK );
	return JX9_OK;
}